

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O2

string * CLParser::FilterShowIncludes
                   (string *__return_storage_ptr__,string *line,string *deps_prefix)

{
  size_type sVar1;
  pointer __s1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  allocator<char> local_51;
  string kDepsPrefixEnglish;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kDepsPrefixEnglish,"Note: including file: ",&local_51);
  sVar1 = deps_prefix->_M_string_length;
  sVar4 = sVar1;
  if (sVar1 == 0) {
    sVar4 = kDepsPrefixEnglish._M_string_length;
  }
  if ((long)(int)sVar4 < (long)line->_M_string_length) {
    __s1 = (line->_M_dataplus)._M_p;
    if (sVar1 == 0) {
      deps_prefix = &kDepsPrefixEnglish;
    }
    iVar3 = bcmp(__s1,(deps_prefix->_M_dataplus)._M_p,(long)(int)sVar4);
    if (iVar3 == 0) {
      lVar5 = sVar4 - 1;
      do {
        lVar2 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (__s1[lVar2] == ' ');
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
      goto LAB_0010c5e0;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_51);
LAB_0010c5e0:
  std::__cxx11::string::~string((string *)&kDepsPrefixEnglish);
  return __return_storage_ptr__;
}

Assistant:

string CLParser::FilterShowIncludes(const string& line,
                                    const string& deps_prefix) {
  const string kDepsPrefixEnglish = "Note: including file: ";
  const char* in = line.c_str();
  const char* end = in + line.size();
  const string& prefix = deps_prefix.empty() ? kDepsPrefixEnglish : deps_prefix;
  if (end - in > (int)prefix.size() &&
      memcmp(in, prefix.c_str(), (int)prefix.size()) == 0) {
    in += prefix.size();
    while (*in == ' ')
      ++in;
    return line.substr(in - line.c_str());
  }
  return "";
}